

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__reload_cache(ma_dr_flac_bs *bs)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *in_RDI;
  size_t bytesRead;
  size_t i;
  size_t offset;
  size_t alignedL1LineCount;
  size_t bytesRead_1;
  ma_bool32 local_cc;
  ulong local_90;
  ushort local_42;
  
  if (*(int *)(in_RDI + 0x209) == 0) {
    uVar2 = in_RDI[0x208];
    *(ma_uint16 *)(in_RDI + 0x207) =
         ma_dr_flac__crc16_table
         [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                    [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                               [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))] << 8
                                                  ^ ma_dr_flac__crc16_table
                                                    [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                (in_RDI + 0x207) <<
                                                                               8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x207) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x207) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                          (uint)(byte)((ulong)uVar2 >> 0x18))] << 8 ^
                                   ma_dr_flac__crc16_table
                                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                              [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x207) >> 8 ^
                                                                (uint)(byte)((ulong)uVar2 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  in_RDI + 0x207) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x207) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x207) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))]) >> 8 ^
                                         (uint)(byte)((ulong)uVar2 >> 0x10))]) >> 8 ^
               (uint)(byte)((ulong)uVar2 >> 8))] << 8 ^
         ma_dr_flac__crc16_table
         [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                    [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                               [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x207) >> 8 ^
                                                                (uint)(byte)((ulong)uVar2 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  in_RDI + 0x207) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x207) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x207) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))]) >> 8 ^
                                          (uint)(byte)((ulong)uVar2 >> 0x10))] << 8 ^
                                   ma_dr_flac__crc16_table
                                   [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                              [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x207) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x207) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (in_RDI + 
                                                  0x207) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x207) >> 8 ^
                                                                (uint)(byte)((ulong)uVar2 >> 0x38))]
                                                          << 8 ^ ma_dr_flac__crc16_table
                                                                 [(int)((int)(uint)(ushort)(*(ushort
                                                                                              *)(
                                                  in_RDI + 0x207) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x207) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x207) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x207) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x207) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x207) >> 8
                                                        ^ (uint)(byte)((ulong)uVar2 >> 0x38))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x10))]) >> 8 ^
                                         (uint)(byte)((ulong)uVar2 >> 8))]) >> 8 ^ (uint)(byte)uVar2
               )];
  }
  else {
    local_42 = *(ushort *)(in_RDI + 0x207);
    uVar2 = in_RDI[0x208];
    switch(-*(int *)(in_RDI + 0x209)) {
    case 0:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))];
    case -1:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))];
    case -2:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x28))];
    case -3:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x20))];
    case -4:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x18))];
    case -5:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x10))];
    case -6:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 8))];
    case -7:
      local_42 = local_42 << 8 ^
                 ma_dr_flac__crc16_table[(int)((int)(uint)local_42 >> 8 ^ (uint)(byte)uVar2)];
    default:
      *(ushort *)(in_RDI + 0x207) = local_42;
      *(undefined4 *)(in_RDI + 0x209) = 0;
    }
  }
  if (*(uint *)(in_RDI + 5) < 0x200) {
    uVar1 = *(uint *)(in_RDI + 5);
    *(uint *)(in_RDI + 5) = uVar1 + 1;
    in_RDI[0x206] = in_RDI[(ulong)uVar1 + 6];
    bVar3 = true;
  }
  else if (in_RDI[3] == 0) {
    uVar4 = (*(code *)*in_RDI)(in_RDI[2],in_RDI + 6,0x1000);
    *(undefined4 *)(in_RDI + 5) = 0;
    if (uVar4 == 0x1000) {
      uVar1 = *(uint *)(in_RDI + 5);
      *(uint *)(in_RDI + 5) = uVar1 + 1;
      in_RDI[0x206] = in_RDI[(ulong)uVar1 + 6];
      bVar3 = true;
    }
    else {
      local_90 = uVar4 >> 3;
      in_RDI[3] = uVar4 + local_90 * -8;
      if (in_RDI[3] != 0) {
        in_RDI[4] = in_RDI[local_90 + 6];
      }
      if (local_90 == 0) {
        *(undefined4 *)(in_RDI + 5) = 0x200;
        bVar3 = false;
      }
      else {
        lVar5 = 0x200 - local_90;
        for (; local_90 != 0; local_90 = local_90 - 1) {
          in_RDI[local_90 + lVar5 + 5] = in_RDI[local_90 + 5];
        }
        *(int *)(in_RDI + 5) = (int)lVar5;
        uVar1 = *(uint *)(in_RDI + 5);
        *(uint *)(in_RDI + 5) = uVar1 + 1;
        in_RDI[0x206] = in_RDI[(ulong)uVar1 + 6];
        bVar3 = true;
      }
    }
  }
  else {
    bVar3 = false;
  }
  if (bVar3) {
    uVar4 = in_RDI[0x206];
    in_RDI[0x206] =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    in_RDI[0x208] = in_RDI[0x206];
    local_cc = 1;
  }
  else if (in_RDI[3] == 0) {
    *(undefined4 *)((long)in_RDI + 0x2c) = 0x40;
    local_cc = 0;
  }
  else {
    *(int *)((long)in_RDI + 0x2c) = (8 - (int)in_RDI[3]) * 8;
    uVar4 = in_RDI[4];
    in_RDI[0x206] =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    in_RDI[0x206] =
         (0xffffffffffffffffU >> (0x40U - (char)*(undefined4 *)((long)in_RDI + 0x2c) & 0x3f) ^
         0xffffffffffffffff) & in_RDI[0x206];
    in_RDI[3] = 0;
    in_RDI[0x208] = (ulong)in_RDI[0x206] >> ((byte)*(undefined4 *)((long)in_RDI + 0x2c) & 0x3f);
    *(uint *)(in_RDI + 0x209) = *(uint *)((long)in_RDI + 0x2c) >> 3;
    local_cc = 1;
  }
  return local_cc;
}

Assistant:

static ma_bool32 ma_dr_flac__reload_cache(ma_dr_flac_bs* bs)
{
    size_t bytesRead;
#ifndef MA_DR_FLAC_NO_CRC
    ma_dr_flac__update_crc16(bs);
#endif
    if (ma_dr_flac__reload_l1_cache_from_l2(bs)) {
        bs->cache = ma_dr_flac__be2host__cache_line(bs->cache);
        bs->consumedBits = 0;
#ifndef MA_DR_FLAC_NO_CRC
        bs->crc16Cache = bs->cache;
#endif
        return MA_TRUE;
    }
    bytesRead = bs->unalignedByteCount;
    if (bytesRead == 0) {
        bs->consumedBits = MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        return MA_FALSE;
    }
    MA_DR_FLAC_ASSERT(bytesRead < MA_DR_FLAC_CACHE_L1_SIZE_BYTES(bs));
    bs->consumedBits = (ma_uint32)(MA_DR_FLAC_CACHE_L1_SIZE_BYTES(bs) - bytesRead) * 8;
    bs->cache = ma_dr_flac__be2host__cache_line(bs->unalignedCache);
    bs->cache &= MA_DR_FLAC_CACHE_L1_SELECTION_MASK(MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs));
    bs->unalignedByteCount = 0;
#ifndef MA_DR_FLAC_NO_CRC
    bs->crc16Cache = bs->cache >> bs->consumedBits;
    bs->crc16CacheIgnoredBytes = bs->consumedBits >> 3;
#endif
    return MA_TRUE;
}